

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_make_transformation_translationv2(matrix3 *self,vector2 *translation)

{
  *(undefined8 *)&self->field_0 = 0x3f800000;
  *(undefined8 *)((long)&self->field_0 + 8) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x10) = 0x3f800000;
  *(undefined8 *)((long)&self->field_0 + 0x18) = 0;
  (self->field_0).m[8] = 1.0;
  (self->field_0).m[2] = (translation->field_0).v[0];
  (self->field_0).m[5] = (translation->field_0).v[1];
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_make_transformation_translationv2(struct matrix3 *self, const struct vector2 *translation)
{
	matrix3_identity(self);

	self->r02 = translation->x;
	self->r12 = translation->y;

	return self;
}